

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O1

void __thiscall
CTestResource_Test2DTileYResourceMips_Test::TestBody
          (CTestResource_Test2DTileYResourceMips_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  CTestResource_Test2DTileYResourceMips_Test *pCVar1;
  uint32_t uVar2;
  int iVar3;
  bool bVar4;
  undefined4 uVar5;
  GMM_RESOURCE_INFO *pGVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  CTestResource_Test2DTileYResourceMips_Test *local_e8;
  uint local_dc;
  uint32_t uStack_d8;
  uint32_t HeightOfPrevMipsInTile;
  long local_d0;
  undefined8 local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  unsigned_long local_98;
  uint auStack_90 [11];
  uint local_64;
  uint32_t SizeOfMip0;
  undefined4 uStack_5c;
  uint local_54;
  uint32_t MipOffset;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  uVar12 = 0;
  local_e8 = this;
  do {
    local_108 = 0;
    uStack_150 = 0;
    uStack_120 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_148 = 0;
    uStack_140 = 0;
    uStack_100 = 0x100000000;
    uStack_160 = 0x400000000;
    local_158 = 0x1000000000;
    local_138 = 0x200;
    uStack_130 = 0x200;
    local_128 = 9;
    uVar11 = (uint)uVar12;
    uVar5 = 0;
    if (uVar11 < 5) {
      uVar5 = (&DAT_001ad6d0)[uVar12];
    }
    _local_168 = CONCAT44(uVar5,2);
    _SizeOfMip0 = (GMM_RESOURCE_INFO *)
                  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                            (CommonULT::pGmmULTClientContext,&local_168);
    iVar9 = 0;
    if (uVar11 < 5) {
      iVar9 = (&DAT_001ad674)[uVar12];
    }
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 1;
    uStack_c0 = 0;
    (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&local_c8);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)&gtest_ar.message_,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x406,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x407,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x408,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x409,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    local_c8 = 1;
    uStack_c0 = 1;
    (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&local_c8);
    auStack_90[10] = iVar9 << 0x12;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_48,"SizeOfMip0","OffsetInfo.Render.Offset64",auStack_90 + 10,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x412,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x413,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x414,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x415,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    local_c8 = 1;
    uStack_c0 = 2;
    (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&local_c8);
    local_54 = iVar9 * 0x2000 + auStack_90[10];
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_48,"MipOffset","OffsetInfo.Render.Offset64",&local_54,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x41e,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x41f,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x420,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x421,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    local_64 = uVar11;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_d0 = CONCAT44(local_d0._4_4_,iVar9);
    _uStack_d8 = CONCAT44(HeightOfPrevMipsInTile,iVar9 << 9);
    uVar11 = 3;
    iVar9 = 0x200;
    do {
      auStack_90[6] = 0;
      auStack_90[7] = 0;
      auStack_90[8] = 0;
      auStack_90[9] = 0;
      auStack_90[2] = 0;
      auStack_90[3] = 0;
      auStack_90[4] = 0;
      auStack_90[5] = 0;
      local_98 = 0;
      auStack_90[0] = 0;
      auStack_90[1] = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 1;
      uStack_c0 = (ulong)uVar11;
      (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&local_c8);
      uVar8 = 0x200 >> ((char)uVar11 - 1U & 0x1f);
      local_54 = local_54 + uVar8 * uStack_d8;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"MipOffset","OffsetInfo.Render.Offset64",&local_54,&local_98);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x42e,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x430,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x431,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x432,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar9 = iVar9 + uVar8;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 6);
    local_dc = 0;
    uVar11 = 6;
    iVar3 = (int)local_d0;
    do {
      auStack_90[6] = 0;
      auStack_90[7] = 0;
      auStack_90[8] = 0;
      auStack_90[9] = 0;
      auStack_90[2] = 0;
      auStack_90[3] = 0;
      auStack_90[4] = 0;
      auStack_90[5] = 0;
      local_98 = 0;
      auStack_90[0] = 0;
      auStack_90[1] = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 1;
      uStack_c0 = (ulong)uVar11;
      (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&local_c8);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"MipOffset","OffsetInfo.Render.Offset64",&local_54,&local_98);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x43f,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x442,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_dc = local_dc + (0x200U >> ((char)uVar11 - 1U & 0x1f));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"HeightOfPrevMipsInTile","OffsetInfo.Render.YOffset",&local_dc,
                 auStack_90 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x444,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x445,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 9);
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 1;
    uStack_c0 = 9;
    (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&local_c8);
    local_54 = local_54 + iVar3 * 0x4000;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_48,"MipOffset","OffsetInfo.Render.Offset64",&local_54,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x450,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x451,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x452,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x453,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pGVar6 = _SizeOfMip0;
    pCVar1 = local_e8;
    uVar2 = uStack_d8;
    CTestResource::VerifyResourceSize<true>
              (&local_e8->super_CTestResource,_SizeOfMip0,(ulong)((iVar9 + 0x40) * uStack_d8));
    CTestResource::VerifyResourcePitch<true>(&pCVar1->super_CTestResource,pGVar6,uVar2);
    CTestResource::VerifyResourcePitchInTiles<true>
              (&pCVar1->super_CTestResource,pGVar6,(int)local_d0 << 2);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar6);
    uVar12 = (ulong)(local_64 + 1);
  } while (local_64 + 1 != 5);
  this_00 = &gtest_ar.message_;
  local_d0 = 0;
  uVar11 = 0;
  do {
    local_108 = 0;
    uStack_150 = 0;
    uStack_120 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_148 = 0;
    uStack_140 = 0;
    uStack_100 = 0x100000000;
    uStack_160 = 0x400000000;
    local_158 = 0x1000000000;
    local_138 = 4;
    uStack_130 = 2;
    local_128 = 2;
    uVar5 = 0;
    if (uVar11 < 5) {
      uVar5 = *(undefined4 *)((long)&DAT_001ad6d0 + local_d0);
    }
    _local_168 = CONCAT44(uVar5,2);
    pGVar6 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_168);
    _uStack_d8 = (**(code **)(*(long *)pGVar6 + 0x228))(pGVar6);
    iVar9 = (**(code **)(*(long *)pGVar6 + 0x230))(pGVar6);
    local_64 = 0;
    _SizeOfMip0 = (GMM_RESOURCE_INFO *)CONCAT44(uStack_5c,uVar11);
    if (uVar11 < 5) {
      local_64 = *(uint *)((long)&DAT_001ad674 + local_d0);
    }
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 1;
    uStack_c0 = 0;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&local_c8);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x486,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)this_00,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x487,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)this_00,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x488,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x489,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    local_c8 = 1;
    uStack_c0 = 1;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&local_c8);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x490,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)this_00,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x491,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar11 = -iVar9 & iVar9 + 1U;
    gtest_ar.message_.ptr_._0_4_ = uVar11;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_48,
               "(((ResourceHeight) + ((VAlign) - 1)) - (((ResourceHeight) + ((VAlign) - 1)) & ((VAlign) - 1)))"
               ,"OffsetInfo.Render.YOffset",(uint *)this_00,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x492,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x493,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    local_c8 = 1;
    uStack_c0 = 2;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&local_c8);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,&local_98);
    uVar2 = SizeOfMip0;
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49a,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar9 = 0;
    if (uVar2 < 5) {
      iVar9 = *(int *)((long)&DAT_001ad674 + local_d0);
    }
    uVar8 = -(int)_uStack_d8;
    uVar10 = (int)_uStack_d8 + 1U & uVar8;
    auStack_90[10] = iVar9 * uVar10;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_48,"Mip1Width","OffsetInfo.Render.XOffset",auStack_90 + 10,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49c,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_48,
               "(((ResourceHeight) + ((VAlign) - 1)) - (((ResourceHeight) + ((VAlign) - 1)) & ((VAlign) - 1)))"
               ,"OffsetInfo.Render.YOffset",(uint *)this_00,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49d,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49e,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pCVar1 = local_e8;
    uVar11 = local_64 * (uVar10 + ((uint)_uStack_d8 & uVar8)) + 0x7f;
    CTestResource::VerifyResourceSize<true>(&local_e8->super_CTestResource,pGVar6,0x1000);
    CTestResource::VerifyResourcePitch<true>
              (&pCVar1->super_CTestResource,pGVar6,uVar11 & 0xffffff80);
    CTestResource::VerifyResourcePitchInTiles<true>(&pCVar1->super_CTestResource,pGVar6,uVar11 >> 7)
    ;
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar6);
    uVar11 = SizeOfMip0 + 1;
    local_d0 = local_d0 + 4;
  } while (uVar11 != 3);
  return;
}

Assistant:

TEST_F(CTestResource, Test2DTileYResourceMips)
{
    const uint32_t TileSize[2] = {128, 32};
    enum Coords
    {
        X = 0,
        Y = 1
    };

    // Test normal mip case
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        const uint32_t ResourceWidth  = 0x200;
        const uint32_t ResourceHeight = 0x200;
        const uint32_t MaxLod         = 0x9;


        TEST_BPP             bpp       = static_cast<TEST_BPP>(i);
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.Flags.Info.TiledY    = 1;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = ResourceWidth;
        gmmParams.BaseHeight           = ResourceHeight;
        gmmParams.MaxLod               = MaxLod;
        gmmParams.Format               = SetResourceFormat(bpp);

        // Create resource
        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        // Mip0 is the widest mip. So it will dictate the pitch of the whole surface
        const uint32_t Pitch            = ResourceWidth * GetBppValue(bpp);
        uint32_t       AllocationHeight = 0;

        // Mip0 should be at offset 0 and tile aligned
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip1 should be after whole Mip0. Should still be tile aligned.
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 1; // Mip 1
        ResourceInfo->GetOffset(OffsetInfo);
        uint32_t SizeOfMip0      = Pitch * ResourceHeight;
        uint32_t HeightOfPrevMip = AllocationHeight = ResourceHeight;
        EXPECT_EQ(SizeOfMip0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip2 should be on the right of Mip1. Should still be tile aligned.
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 2; // Mip 2
        ResourceInfo->GetOffset(OffsetInfo);
        // MipOffset = Mip1Offset + Mip1Width in tiles
        uint32_t MipOffset = SizeOfMip0 + ((Pitch >> 1) / TileSize[X]) * PAGE_SIZE;
        EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mips 3-5 should be on tile boundary
        for(int i = 3; i < 6; i++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = i;
            ResourceInfo->GetOffset(OffsetInfo);

            HeightOfPrevMip = (ResourceHeight >> (i - 1));
            AllocationHeight += HeightOfPrevMip;
            MipOffset += Pitch * HeightOfPrevMip;
            EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
            // No X/Y/Z offset since mip is at tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        // Mips 6-8 will share 1 tile
        AllocationHeight += TileSize[Y];
        uint32_t HeightOfPrevMipsInTile = 0;
        for(int i = 6; i < 9; i++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = i;
            ResourceInfo->GetOffset(OffsetInfo);

            EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64); // Same as previous tile aligned mip offset

            // X is 0, but Y offset will change
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            HeightOfPrevMipsInTile += (ResourceHeight >> (i - 1));
            EXPECT_EQ(HeightOfPrevMipsInTile, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        // Mip 9 is back on tile boundary
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 9; // Mip 9
        ResourceInfo->GetOffset(OffsetInfo);

        MipOffset += Pitch * TileSize[Y];
        AllocationHeight += TileSize[Y];
        EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Verify ResourceSize and Pitch
        VerifyResourceSize<true>(ResourceInfo, AllocationHeight * Pitch);
        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[X]);
        // These are verified elsewhere
        VerifyResourceHAlign<false>(ResourceInfo, 0);
        VerifyResourceVAlign<false>(ResourceInfo, 0);
        VerifyResourceQPitch<false>(ResourceInfo, 0);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }


    // Test where Mip1 + Mip2 width > Mip0 width, and where everything fits in 1 tile
    for(uint32_t i = 0; i < TEST_BPP_64; i++)
    {
        const uint32_t ResourceWidth  = 0x4;
        const uint32_t ResourceHeight = 0x2;
        const uint32_t MaxLod         = 0x2;

        TEST_BPP             bpp       = static_cast<TEST_BPP>(i);
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.Flags.Info.TiledY    = 1;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = ResourceWidth;
        gmmParams.BaseHeight           = ResourceHeight;
        gmmParams.MaxLod               = MaxLod;
        gmmParams.Format               = SetResourceFormat(bpp);

        // Create resource
        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        // Get Alignment that GmmLib is using
        const uint32_t HAlign = ResourceInfo->GetHAlign();
        const uint32_t VAlign = ResourceInfo->GetVAlign();

        // Mip1 + Mip2 is the widest width. So it will dictate the pitch of the whole surface
        uint32_t Pitch = GetBppValue(bpp) *
                         (GMM_ULT_ALIGN(ResourceWidth >> 1, HAlign) + GMM_ULT_ALIGN(ResourceWidth >> 2, HAlign));
        Pitch = GMM_ULT_ALIGN(Pitch, TileSize[X]);

        // Mip0 should be at offset 0 and tile aligned
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip1 should be after whole Mip0. Not tile aligned
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 1; // Mip 1
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64); // Same tile as Mip0
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(GMM_ULT_ALIGN(ResourceHeight, VAlign), OffsetInfo.Render.YOffset); // After Mip0
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip2 should be on the right of Mip1. Not tile aligned
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 2; // Mip 2
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64); // Same Tile as Mip0
        uint32_t Mip1Width = GMM_ULT_ALIGN(ResourceWidth >> 1, HAlign) * GetBppValue(bpp);
        EXPECT_EQ(Mip1Width, OffsetInfo.Render.XOffset);                             // On right of Mip1
        EXPECT_EQ(GMM_ULT_ALIGN(ResourceHeight, VAlign), OffsetInfo.Render.YOffset); // After Mip0
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Verify ResourceSize and Pitch
        VerifyResourceSize<true>(ResourceInfo, PAGE_SIZE); // everything should fit in 1 tile
        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[X]);
        // These are verified elsewhere
        VerifyResourceHAlign<false>(ResourceInfo, 0);
        VerifyResourceVAlign<false>(ResourceInfo, 0);
        VerifyResourceQPitch<false>(ResourceInfo, 0);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}